

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threefishApi.c
# Opt level: O0

void threefishEncryptBlockWords(ThreefishKey_t *keyCtx,uint64_t *in,uint64_t *out)

{
  u64b_t uVar1;
  uint64_t *out_local;
  uint64_t *in_local;
  ThreefishKey_t *keyCtx_local;
  
  uVar1 = keyCtx->stateSize;
  if (uVar1 == 0x100) {
    threefishEncrypt256(keyCtx,in,out);
  }
  else if (uVar1 == 0x200) {
    threefishEncrypt512(keyCtx,in,out);
  }
  else if (uVar1 == 0x400) {
    threefishEncrypt1024(keyCtx,in,out);
  }
  return;
}

Assistant:

void threefishEncryptBlockWords(ThreefishKey_t* keyCtx, uint64_t* in,
                                uint64_t* out)
{
    switch (keyCtx->stateSize) {
        case Threefish256:
            threefishEncrypt256(keyCtx, in, out);
            break;
        case Threefish512:
            threefishEncrypt512(keyCtx, in, out);
            break;
        case Threefish1024:
            threefishEncrypt1024(keyCtx, in, out);
            break;
    }
}